

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.h
# Opt level: O2

int __thiscall HashMap<int>::init(HashMap<int> *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  int iVar1;
  undefined4 extraout_var;
  Node **__s;
  void *pvVar2;
  
  if (this->entries != (Node **)0x0) {
    return in_EAX;
  }
  if (this->allocator == (Allocator *)0x0) {
    __s = (Node **)(*(code *)NULLC::alloc)(0x2004);
  }
  else {
    iVar1 = (*this->allocator->_vptr_Allocator[2])();
    __s = (Node **)CONCAT44(extraout_var,iVar1);
  }
  this->entries = __s;
  pvVar2 = memset(__s,0,0x2000);
  return (int)pvVar2;
}

Assistant:

void init()
	{
		if(!entries)
		{
			if(allocator)
				entries = allocator->construct<Node*>(bucketCount);
			else
				entries = NULLC::construct<Node*>(bucketCount);

			memset(entries, 0, sizeof(Node*) * bucketCount);
		}
	}